

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int checkIfPasswordMatches(User *user)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char salt [2];
  char stored_enc_psswd [32];
  char stored_username [16];
  char line [50];
  char res [512];
  undefined2 local_2aa;
  undefined2 local_2a8 [16];
  char local_288 [16];
  char local_278 [64];
  char local_238 [520];
  
  pthread_mutex_lock((pthread_mutex_t *)&users_lock_g);
  __stream = fopen(USER_FILE,"r");
  if (__stream == (FILE *)0x0) {
    checkIfPasswordMatches_cold_1();
    iVar1 = -1;
  }
  else {
    pcVar2 = fgets(local_278,0x32,__stream);
    if (pcVar2 != (char *)0x0) {
      do {
        __isoc99_sscanf(local_278,"%s %s",local_288,local_2a8);
        local_2aa = local_2a8[0];
        pcVar2 = crypt(user->actual_password,(char *)&local_2aa);
        strncpy(local_238,pcVar2,0x200);
        iVar1 = strcmp(user->username,local_288);
        if ((iVar1 == 0) && (iVar1 = strcmp(local_238,(char *)local_2a8), iVar1 == 0)) {
          fclose(__stream);
          pthread_mutex_unlock((pthread_mutex_t *)&users_lock_g);
          return 0;
        }
        pcVar2 = fgets(local_278,0x32,__stream);
      } while (pcVar2 != (char *)0x0);
    }
    fclose(__stream);
    pthread_mutex_unlock((pthread_mutex_t *)&users_lock_g);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int 
checkIfPasswordMatches(User* user) 
{
    char stored_username[USERNAME_MAX_LENGTH];
    char stored_enc_psswd[PASSWORD_MAX_LENGTH];
    char line[USERNAME_MAX_LENGTH + PASSWORD_MAX_LENGTH + 2];

    #if ENCRYPT_PASSWORD 
        char salt[2];
    #else
    #endif
    

    char res[512]; // result of decryption operation

    // protecting shared resource with mutex semaphore
    pthread_mutex_lock(&users_lock_g);

    FILE* users_file;

    users_file = fopen(USER_FILE, "r");     // opening file in read mode
    if (users_file == NULL) {
        perror("fopen(USER_FILE)");

        pthread_mutex_unlock(&users_lock_g);
        return -1;       // file is missing...
    }


    // Scroll through the lines of users_file
    while(fgets(line, sizeof(line), users_file)){


        // get username and password from line
        sscanf(line, "%s %s", stored_username, stored_enc_psswd);

        #if ENCRYPT_PASSWORD 
            // retrieve salt
            salt[0] = stored_enc_psswd[0];
            salt[1] = stored_enc_psswd[1];

            
            // copy encrypted password to res and return it.
            #if 1
                strncpy(res, crypt(user->actual_password, salt), sizeof(res)); 
            #else
                memset(res, '\0', sizeof(res));
                strcpy(res, crypt(user->actual_password, salt)); 
            #endif
            
        #else
            strcpy(res, user->actual_password);
        
        #endif
        // if username and password match, login is successful.
        if (strcmp(user->username, stored_username) == 0 && strcmp(res, stored_enc_psswd) == 0){
            fclose(users_file);
            pthread_mutex_unlock(&users_lock_g);
            return 0;
        }
    }

    fclose(users_file);
    pthread_mutex_unlock(&users_lock_g);
    return 1;

}